

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popContext(EGLResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> SVar1;
  
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
             *)CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)this,
             (this_00->
             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
             )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
  ::erase(this_00,(this_00->
                  super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + in_EDX);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (GLES2Context *)this;
  return SVar1;
}

Assistant:

SharedPtr<GLES2Context> EGLResourceManager::popContext (int index)
{
	SharedPtr<GLES2Context> context = m_contexts[index];
	m_contexts.erase(m_contexts.begin() + index);
	return context;
}